

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

lightlist_t * P_GetPlaneLight(sector_t *sector,secplane_t *plane,bool underside)

{
  uint uVar1;
  extsector_t *peVar2;
  ulong uVar3;
  undefined3 in_register_00000011;
  long lVar4;
  double dVar5;
  double dVar6;
  
  peVar2 = sector->e;
  dVar5 = secplane_t::ZatPoint(plane,&sector->centerspot);
  if (CONCAT31(in_register_00000011,underside) != 0) {
    dVar5 = dVar5 + -1.52587890625e-05;
  }
  lVar4 = 0x50;
  uVar3 = 0;
  while( true ) {
    uVar1 = (peVar2->XFloor).lightlist.Count;
    if ((ulong)uVar1 <= uVar3 + 1) break;
    dVar6 = secplane_t::ZatPoint
                      ((secplane_t *)
                       ((long)&(((peVar2->XFloor).lightlist.Array)->plane).normal.X + lVar4),
                       &sector->centerspot);
    if (dVar6 <= dVar5) goto LAB_00475eba;
    lVar4 = lVar4 + 0x50;
    uVar3 = uVar3 + 1;
  }
  uVar3 = (ulong)(uVar1 - 1);
LAB_00475eba:
  return (peVar2->XFloor).lightlist.Array + uVar3;
}

Assistant:

lightlist_t * P_GetPlaneLight(sector_t * sector, secplane_t * plane, bool underside)
{
	unsigned   i;
	TArray<lightlist_t> &lightlist = sector->e->XFloor.lightlist;

	double planeheight=plane->ZatPoint(sector->centerspot);
	if(underside) planeheight-= EQUAL_EPSILON;
	
	for(i = 1; i < lightlist.Size(); i++)
		if (lightlist[i].plane.ZatPoint(sector->centerspot) <= planeheight) 
			return &lightlist[i - 1];
		
	return &lightlist[lightlist.Size() - 1];
}